

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O3

void get_color_map_params
               (MACROBLOCK *x,int plane,BLOCK_SIZE bsize,TX_SIZE tx_size,COLOR_MAP_TYPE type,
               Av1ColorMapParam *params)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  byte bVar6;
  int iVar7;
  bool bVar8;
  int (*paaiVar9) [5] [8];
  undefined7 in_register_00000009;
  long lVar10;
  undefined7 in_register_00000081;
  
  *(undefined8 *)(CONCAT71(in_register_00000081,type) + 0x20) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000081,type) + 0x28) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000081,type) + 0x10) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000081,type) + 0x18) = 0;
  *(undefined8 *)CONCAT71(in_register_00000081,type) = 0;
  ((undefined8 *)CONCAT71(in_register_00000081,type))[1] = 0;
  if ((int)CONCAT71(in_register_00000009,tx_size) != 0) {
    return;
  }
  pMVar5 = *(x->e_mbd).mi;
  lVar10 = 0x294e;
  if (plane == 0) {
    lVar10 = 0x26d8;
  }
  paaiVar9 = (x->mode_costs).palette_uv_color_cost;
  if (plane == 0) {
    paaiVar9 = (x->mode_costs).palette_y_color_cost;
  }
  *(uint8_t **)(CONCAT71(in_register_00000081,type) + 0x18) =
       (x->e_mbd).plane[plane].color_index_map;
  *(long *)(CONCAT71(in_register_00000081,type) + 0x20) =
       (long)((x->e_mbd).tile_ctx)->txb_skip_cdf[0][0] + lVar10;
  *(int (**) [5] [8])(CONCAT71(in_register_00000081,type) + 0x28) = paaiVar9;
  *(uint *)(CONCAT71(in_register_00000081,type) + 8) =
       (uint)(pMVar5->palette_mode_info).palette_size[plane];
  bVar1 = block_size_high[bsize];
  bVar2 = block_size_wide[bsize];
  iVar3 = (x->e_mbd).mb_to_right_edge;
  iVar4 = (x->e_mbd).mb_to_bottom_edge;
  iVar7 = (x->e_mbd).plane[plane].subsampling_y;
  bVar6 = bVar2 >> ((byte)(x->e_mbd).plane[plane].subsampling_x & 0x1f);
  bVar8 = bVar6 < 4 && 0 < plane;
  *(uint *)(CONCAT71(in_register_00000081,type) + 0xc) = (uint)bVar6 + (uint)bVar8 * 2;
  *(uint *)CONCAT71(in_register_00000081,type) =
       ((int)((iVar4 >> 0x1f & iVar4 >> 3) + (uint)bVar1) >>
       ((byte)(x->e_mbd).plane[plane].subsampling_y & 0x1f)) +
       (uint)(bVar1 >> ((byte)iVar7 & 0x1f) < 4 && 0 < plane) * 2;
  *(uint *)(CONCAT71(in_register_00000081,type) + 4) =
       ((int)((iVar3 >> 0x1f & iVar3 >> 3) + (uint)bVar2) >>
       ((byte)(x->e_mbd).plane[plane].subsampling_x & 0x1f)) + (uint)bVar8 * 2;
  return;
}

Assistant:

static void get_color_map_params(const MACROBLOCK *const x, int plane,
                                 BLOCK_SIZE bsize, TX_SIZE tx_size,
                                 COLOR_MAP_TYPE type,
                                 Av1ColorMapParam *params) {
  (void)tx_size;
  memset(params, 0, sizeof(*params));
  switch (type) {
    case PALETTE_MAP: get_palette_params(x, plane, bsize, params); break;
    default: assert(0 && "Invalid color map type"); return;
  }
}